

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcssub.c
# Opt level: O1

int ffgiwcs(fitsfile *fptr,char **header,int *status)

{
  uint uVar1;
  int iVar2;
  int hdutype;
  undefined8 uStack_28;
  
  uVar1 = *status;
  uStack_28 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    return uVar1;
  }
  ffghdt(fptr,(int *)((long)&uStack_28 + 4),status);
  if (uStack_28._4_4_ == 0) {
    iVar2 = ffh2st(fptr,header,status);
    if (0 < iVar2) {
      ffpmsg("error creating string of image WCS keywords (ffgiwcs)");
    }
    iVar2 = *status;
  }
  else {
    ffpmsg("Error in ffgiwcs. This HDU is not an image. Can\'t read WCS keywords");
    *status = 0xe9;
    iVar2 = 0xe9;
  }
  return iVar2;
}

Assistant:

int ffgiwcs(fitsfile *fptr,  /* I - FITS file pointer                    */
           char **header,   /* O - pointer to the WCS related keywords  */
           int *status)     /* IO - error status                        */
/*
  int fits_get_image_wcs_keys 
  return a string containing all the image WCS header keywords.
  This string is then used as input to the wcsinit WCSlib routine.
  
  THIS ROUTINE IS DEPRECATED. USE fits_hdr2str INSTEAD
*/
{
    int hdutype;

    if (*status > 0)
        return(*status);

    fits_get_hdu_type(fptr, &hdutype, status);
    if (hdutype != IMAGE_HDU)
    {
      ffpmsg(
     "Error in ffgiwcs. This HDU is not an image. Can't read WCS keywords");
      return(*status = NOT_IMAGE);
    }

    /* read header keywords into a long string of chars */
    if (ffh2st(fptr, header, status) > 0)
    {
        ffpmsg("error creating string of image WCS keywords (ffgiwcs)");
        return(*status);
    }

    return(*status);
}